

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_cte.hpp
# Opt level: O3

void __thiscall
duckdb::LogicalCTE::LogicalCTE
          (LogicalCTE *this,string *ctename_p,idx_t table_index,idx_t column_count,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *top,unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *bottom,LogicalOperatorType logical_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_00;
  pointer pcVar3;
  undefined8 uVar4;
  
  LogicalOperator::LogicalOperator(&this->super_LogicalOperator,logical_type);
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)&PTR__LogicalCTE_0243d378;
  paVar1 = &(this->ctename).field_2;
  (this->ctename)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (ctename_p->_M_dataplus)._M_p;
  paVar2 = &ctename_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&ctename_p->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->ctename).field_2 + 8) = uVar4;
  }
  else {
    (this->ctename)._M_dataplus._M_p = pcVar3;
    (this->ctename).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->ctename)._M_string_length = ctename_p->_M_string_length;
  (ctename_p->_M_dataplus)._M_p = (pointer)paVar2;
  ctename_p->_M_string_length = 0;
  (ctename_p->field_2)._M_local_buf[0] = '\0';
  this->table_index = table_index;
  this->column_count = column_count;
  (this->correlated_columns).
  super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->correlated_columns).
  super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->correlated_columns).
  super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_LogicalOperator).children;
  ::std::
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
            ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
              *)this_00,top);
  ::std::
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
            ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
              *)this_00,bottom);
  return;
}

Assistant:

explicit LogicalCTE(string ctename_p, idx_t table_index, idx_t column_count, unique_ptr<LogicalOperator> top,
	                    unique_ptr<LogicalOperator> bottom,
	                    LogicalOperatorType logical_type = LogicalOperatorType::LOGICAL_INVALID)
	    : LogicalOperator(logical_type), ctename(std::move(ctename_p)), table_index(table_index),
	      column_count(column_count) {
		children.push_back(std::move(top));
		children.push_back(std::move(bottom));
	}